

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

void __thiscall spirv_cross::Variant::set(Variant *this,IVariant *val,Types new_type)

{
  pointer pOVar1;
  CompilerError *this_00;
  allocator local_41;
  string local_40 [36];
  Types local_1c;
  IVariant *pIStack_18;
  Types new_type_local;
  IVariant *val_local;
  Variant *this_local;
  
  local_1c = new_type;
  pIStack_18 = val;
  val_local = (IVariant *)this;
  if (this->holder != (IVariant *)0x0) {
    pOVar1 = ::std::
             unique_ptr<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
             ::operator->(this->group->pools + this->type);
    (*pOVar1->_vptr_ObjectPoolBase[2])(pOVar1,this->holder);
  }
  this->holder = (IVariant *)0x0;
  if ((((this->allow_type_rewrite & 1U) == 0) && (this->type != TypeNone)) &&
     (this->type != local_1c)) {
    if (pIStack_18 != (IVariant *)0x0) {
      pOVar1 = ::std::
               unique_ptr<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
               ::operator->(this->group->pools + local_1c);
      (*pOVar1->_vptr_ObjectPoolBase[2])(pOVar1,pIStack_18);
    }
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_40,"Overwriting a variant with new type.",&local_41);
    CompilerError::CompilerError(this_00,(string *)local_40);
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  this->holder = pIStack_18;
  this->type = local_1c;
  this->allow_type_rewrite = false;
  return;
}

Assistant:

void set(IVariant *val, Types new_type)
	{
		if (holder)
			group->pools[type]->deallocate_opaque(holder);
		holder = nullptr;

		if (!allow_type_rewrite && type != TypeNone && type != new_type)
		{
			if (val)
				group->pools[new_type]->deallocate_opaque(val);
			SPIRV_CROSS_THROW("Overwriting a variant with new type.");
		}

		holder = val;
		type = new_type;
		allow_type_rewrite = false;
	}